

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_zeros_with_exceptions_Test::
FastPForTest_fastpack_zeros_with_exceptions_Test
          (FastPForTest_fastpack_zeros_with_exceptions_Test *this)

{
  FastPForTest *in_RDI;
  
  FastPForTest::FastPForTest(in_RDI);
  (in_RDI->
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Test._vptr_Test =
       (_func_int **)&PTR__FastPForTest_fastpack_zeros_with_exceptions_Test_0033f4f0;
  (in_RDI->
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__FastPForTest_fastpack_zeros_with_exceptions_Test_0033f530;
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_zeros_with_exceptions) {
    in32.clear();
    in32.push_back(1024);
    for (int i = 0; i < 254; ++i) {
      in32.push_back(0);
    }
    in32.push_back(1033);

    _verify();
    _copy64();
    _verify64();
  }